

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  basic_appender<char> bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint **ppuVar8;
  uint uVar9;
  uint **ppuVar10;
  long lVar11;
  size_t sVar12;
  undefined1 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  char cVar16;
  basic_specs significand_00;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  buffer<char> *buf;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_e6 [14];
  uint local_d8;
  undefined1 local_d4 [12];
  format_specs local_c8;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  uint *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  significand_00 = (basic_specs)f->significand;
  uVar17 = f->significand_size;
  local_d4._4_8_ = ZEXT48(uVar17);
  uVar7 = (ulong)((uVar17 + 1) - (uint)(s == none));
  local_e6[1] = '0';
  uVar9 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_e6._6_8_ = out.container;
  local_d8 = uVar17;
  local_d4._0_4_ = s;
  local_c8.super_basic_specs = significand_00;
  if ((uVar9 >> 0xe & 1) != 0) {
    local_c8.width = s;
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar17 = (uint)local_d4._4_8_;
    uVar9 = (specs->super_basic_specs).data_;
    s = local_c8.width;
  }
  uVar15 = auStack_a4._4_8_;
  uVar14 = local_e6._6_8_;
  uVar1 = f->exponent;
  iVar19 = uVar17 + uVar1;
  iVar6 = specs->precision;
  bVar5 = (byte)uVar9 & 7;
  local_d4._4_8_ = f;
  if (bVar5 == 1) goto LAB_00469585;
  if ((uVar9 & 7) != 2) {
    if (iVar19 < -3) {
LAB_00469585:
      iVar20 = uVar17 + uVar1 + -1;
      if ((uVar9 >> 0xd & 1) == 0) {
        uVar2 = 0;
        if (uVar17 == 1) {
          local_e6[0] = '\0';
          uVar2 = 0;
        }
      }
      else {
        uVar2 = 0;
        if (0 < (int)(iVar6 - uVar17)) {
          uVar2 = (ulong)(iVar6 - uVar17);
        }
        uVar7 = uVar7 + uVar2;
      }
      uVar13 = local_e6[0];
      iVar6 = 1 - iVar19;
      if (0 < iVar19) {
        iVar6 = iVar20;
      }
      lVar11 = 2;
      if (99 < iVar6) {
        lVar11 = (ulong)(999 < iVar6) + 3;
      }
      sVar12 = (3 - (ulong)(local_e6[0] == '\0')) + uVar7 + lVar11;
      local_b8._0_4_ = s;
      auStack_a4[0] = local_e6[0];
      local_b8._16_4_ = uVar17;
      auStack_a4._4_5_ = CONCAT14('0',(int)uVar2);
      auStack_a4._10_2_ = SUB82(uVar15,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar9 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar20;
      local_b8._8_8_ = significand_00;
      if (specs->width < 1) {
        uVar7 = sVar12 + *(size_t *)(local_e6._6_8_ + 8);
        if (*(size_t *)(local_e6._6_8_ + 0x10) < uVar7) {
          (**(grow_fun *)(local_e6._6_8_ + 0x18))((buffer<char> *)local_e6._6_8_,uVar7);
        }
        iVar6 = (int)uVar2;
        if (s != none) {
          sVar12 = *(size_t *)(uVar14 + 8);
          uVar7 = sVar12 + 1;
          if (*(size_t *)(uVar14 + 0x10) < uVar7) {
            (**(grow_fun *)(uVar14 + 0x18))((buffer<char> *)uVar14,uVar7);
            sVar12 = *(size_t *)(uVar14 + 8);
            uVar7 = sVar12 + 1;
          }
          *(ulong *)(uVar14 + 8) = uVar7;
          *(char *)(*(long *)uVar14 + sVar12) = (char)(0x202b2d00 >> ((byte)(s << 3) & 0x1f));
          significand_00 = (basic_specs)local_b8._8_8_;
          uVar13 = auStack_a4[0];
          iVar6 = auStack_a4._4_4_;
          uVar17 = local_b8._16_4_;
        }
        bVar4 = write_significand<fmt::v11::basic_appender<char>,char>
                          ((basic_appender<char>)uVar14,(char *)significand_00,uVar17,1,uVar13);
        if (0 < iVar6) {
          bVar4 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar4,iVar6,auStack_a4 + 8);
        }
        uVar13 = auStack_a4[9];
        sVar12 = (bVar4.container)->size_;
        uVar7 = sVar12 + 1;
        if ((bVar4.container)->capacity_ < uVar7) {
          (*(bVar4.container)->grow_)(bVar4.container,uVar7);
          sVar12 = (bVar4.container)->size_;
          uVar7 = sVar12 + 1;
        }
        (bVar4.container)->size_ = uVar7;
        (bVar4.container)->ptr_[sVar12] = uVar13;
        bVar4 = write_exponent<char,fmt::v11::basic_appender<char>>(auStack_a4._12_4_,bVar4);
      }
      else {
        bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_e6._6_8_,specs,sVar12,sVar12,
                           (anon_class_40_8_fd1bf2f9 *)local_b8);
      }
      return (basic_appender<char>)bVar4.container;
    }
    if (0 < iVar6) {
      exp_upper = iVar6;
    }
    if (exp_upper < iVar19) goto LAB_00469585;
  }
  local_c8.precision = iVar19;
  if (-1 < (int)uVar1) {
    lVar11 = uVar1 + uVar7;
    local_e6._2_4_ = iVar6 - iVar19;
    if ((uVar9 >> 0xd & 1) != 0) {
      lVar11 = lVar11 + 1;
      if (((int)local_e6._2_4_ < 1) && (bVar5 != 2)) {
        local_e6._2_4_ = 0;
      }
      else if (0 < (int)local_e6._2_4_) {
        lVar11 = lVar11 + (ulong)(uint)local_e6._2_4_;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar9 >> 0xe) & 1));
    iVar6 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppuVar10 = (uint **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar3 = 0;
      uVar15 = local_70._0_8_;
      do {
        if ((uint **)uVar15 == ppuVar10) {
          cVar16 = *(char *)((long)ppuVar10 + -1);
          uVar15 = ppuVar10;
        }
        else {
          cVar16 = *(char *)uVar15;
          if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_00469841;
          uVar15 = (uint **)(uVar15 + 1);
        }
        iVar6 = iVar6 + cVar16;
        if (iVar19 <= iVar6) goto LAB_00469841;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_00469841:
    local_b8._0_8_ = local_d4;
    local_b8._8_8_ = &local_c8;
    unique0x00004e80 = &local_d8;
    auStack_a4._4_8_ = local_d4._4_8_;
    local_88._M_allocated_capacity = (size_type)local_e6;
    local_88._8_8_ = local_e6 + 2;
    local_78 = local_e6 + 1;
    auStack_a4._12_8_ = &local_70;
    local_90 = specs;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)uVar14,specs,lVar11 + lVar3,lVar11 + lVar3,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50,(size_t)(local_40._M_allocated_capacity + 1));
    }
    uVar14 = local_60;
    uVar15 = local_70._0_8_;
    if ((uint **)local_70._0_8_ == &local_60) {
      return (basic_appender<char>)bVar4.container;
    }
LAB_00469a13:
    operator_delete((void *)uVar15,uVar14 + 1);
    return (basic_appender<char>)bVar4.container;
  }
  if (0 < iVar19) {
    uVar18 = 0;
    local_e6._2_4_ = iVar6 - uVar17 & (int)(uVar9 << 0x12) >> 0x1f;
    uVar2 = (ulong)(uint)local_e6._2_4_;
    if ((int)local_e6._2_4_ < 1) {
      uVar2 = uVar18;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar9 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      ppuVar8 = (uint **)(local_b8._0_8_ + (long)(basic_specs *)local_b8._8_8_);
      lVar11 = 0;
      ppuVar10 = (uint **)local_b8._0_8_;
      do {
        if (ppuVar10 == ppuVar8) {
          cVar16 = *(char *)((long)ppuVar8 + -1);
          ppuVar10 = ppuVar8;
        }
        else {
          cVar16 = *(char *)ppuVar10;
          if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_0046998d;
          ppuVar10 = (uint **)((long)ppuVar10 + 1);
        }
        uVar17 = (int)uVar18 + (int)cVar16;
        uVar18 = (ulong)uVar17;
        if (iVar19 <= (int)uVar17) goto LAB_0046998d;
        lVar11 = lVar11 + 1;
      } while( true );
    }
    lVar11 = 0;
LAB_0046998d:
    sVar12 = uVar2 + uVar7 + 1 + lVar11;
    local_70._M_allocated_capacity = (size_type)local_d4;
    local_70._8_8_ = &local_c8;
    local_60 = &local_d8;
    local_58 = &local_c8.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)(local_e6 + 2);
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_e6._6_8_,specs,sVar12,sVar12,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_,(size_t)(local_88._M_allocated_capacity + 1));
    }
    uVar14 = stack0xffffffffffffff58;
    uVar15 = local_b8._0_8_;
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
      return (basic_appender<char>)bVar4.container;
    }
    goto LAB_00469a13;
  }
  iVar20 = -iVar19;
  local_70._M_allocated_capacity._0_4_ = iVar20;
  if (uVar17 == 0) {
    if (SBORROW4(iVar6,iVar20) != iVar6 + iVar19 < 0 && -1 < iVar6) {
      local_70._M_allocated_capacity._0_4_ = iVar6;
      iVar20 = iVar6;
    }
    if (iVar20 == 0) {
      local_e6[2] = (char)((uVar9 & 0x2000) >> 0xd);
      iVar6 = 2 - (uint)((uVar9 & 0x2000) == 0);
      iVar20 = 0;
      goto LAB_0046991f;
    }
  }
  local_e6[2] = 1;
  iVar6 = 2;
LAB_0046991f:
  sVar12 = (uint)(iVar20 + iVar6) + uVar7;
  local_b8._0_8_ = local_d4;
  local_b8._8_8_ = local_e6 + 2;
  unique0x00004e80 = local_e6;
  auStack_a4._4_8_ = &local_70;
  auStack_a4._12_8_ = local_e6 + 1;
  local_90 = &local_c8;
  local_88._M_allocated_capacity = (size_type)&local_d8;
  bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_e6._6_8_,specs,sVar12,sVar12,
                     (anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}